

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.h
# Opt level: O2

size_t __thiscall CoreML::Specification::Int64Range::ByteSizeLong(Int64Range *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (this->minvalue_ == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = this->minvalue_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->maxvalue_ != 0) {
    uVar2 = this->maxvalue_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline ::google::protobuf::int64 Int64Range::minvalue() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.Int64Range.minValue)
  return minvalue_;
}